

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::renderPixel(embree *this,TutorialData *data,float x,float y,ISPCCamera *camera,
                   RayStats *stats)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ISPCType IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  Vec3fa *pVVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vfloat4 a_1;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vfloat4 a;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  vfloat4 a_2;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  Vec3fa VVar41;
  Vec3fa T;
  Vec3ff wi;
  Vec3fa dz;
  RayQueryContext context;
  Vec3fa dx;
  uint local_284;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_258;
  undefined1 local_248 [8];
  float fStack_240;
  undefined4 uStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  float local_218;
  float fStack_214;
  float fStack_210;
  undefined4 local_204;
  uint uStack_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c8;
  Vec3fa *local_1b8;
  Vec3fa *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  undefined4 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined4 local_138;
  undefined1 local_128 [8];
  float fStack_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  RayQueryContext local_d0;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a8;
  undefined8 local_98;
  uint local_74;
  uint uStack_70;
  uint auStack_6c [1];
  uint auStack_68 [1];
  undefined8 local_50;
  RayQueryContext *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 uVar18;
  undefined1 auVar37 [16];
  
  uVar9 = (int)y << 0x10 | (int)x;
  uVar9 = uVar9 * -0x3361d2af >> 0x11 | uVar9 * 0x16a88000;
  uVar9 = (data->accu_count * -0x3361d2af >> 0x11 | data->accu_count * 0x16a88000) * 0x1b873593 ^
          (uVar9 * -0x194da000 | uVar9 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar9 = (uVar9 << 0xd | uVar9 >> 0x13) * 5 + 0xe6546b64;
  uVar9 = (uVar9 >> 0x10 ^ uVar9) * -0x7a143595;
  uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
  uVar9 = uVar9 >> 0x10 ^ uVar9;
  local_48 = &local_d0;
  local_d0.context.instID[0] = 0xffffffff;
  local_d0.context.instPrimID[0] = 0xffffffff;
  local_d0.userRayExt = (void *)0x0;
  local_50 = 0x100004200000000;
  local_40 = 0;
  uStack_38 = 0;
  uVar10 = uVar9 * -0x50b6f56b + 0xd1ccf6e9;
  local_198 = (float)(uVar10 >> 1) * 4.656613e-10;
  fVar11 = x + (float)(uVar9 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
  fVar16 = y + (float)(uVar9 * 0x17385ca9 + 0x47502932 >> 1) * 4.656613e-10;
  auVar33._4_4_ = (camera->xfm).l.vy.field_0.field_0.x * fVar16;
  fVar17 = auVar33._4_4_ + (camera->xfm).l.vx.field_0.field_0.x * fVar11 +
           (camera->xfm).l.vz.field_0.field_0.x;
  uVar18 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar23 = (float)uVar2 + fVar16 * (float)uVar1 + fVar11 * (float)uVar18;
  fVar11 = (float)((ulong)uVar2 >> 0x20) +
           fVar16 * (float)((ulong)uVar1 >> 0x20) + fVar11 * (float)((ulong)uVar18 >> 0x20);
  auVar12._4_4_ = auVar33._4_4_;
  auVar12._0_4_ = fVar17;
  auVar12._8_4_ = auVar33._4_4_;
  auVar12._12_4_ = auVar33._4_4_;
  auVar13._4_12_ = auVar12._4_12_;
  auVar13._0_4_ = fVar17 * fVar17 + fVar23 * fVar23 + fVar11 * fVar11;
  auVar33._0_4_ = auVar13._0_4_;
  auVar33._8_4_ = auVar33._4_4_;
  auVar33._12_4_ = auVar33._4_4_;
  auVar34 = rsqrtss(auVar33,auVar13);
  fVar16 = auVar34._0_4_;
  fVar16 = fVar16 * fVar16 * auVar13._0_4_ * -0.5 * fVar16 + fVar16 * 1.5;
  auVar34._0_4_ = fVar17 * fVar16;
  fStack_240 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_248 = (undefined1  [8])*(undefined8 *)&(camera->xfm).p.field_0;
  uStack_23c = 0;
  auVar34._4_4_ = fVar16 * fVar23;
  auVar34._8_4_ = fVar16 * fVar11;
  auVar34._12_4_ = 0;
  local_1b0 = &data->hair_Kr;
  local_1b8 = &data->hair_Kt;
  uStack_1fc = 0xffffffff;
  uStack_1f8 = 0xffffffff;
  local_284 = 0;
  _local_278 = (undefined1  [16])0x0;
  _local_1e8 = _DAT_0021dbc0;
  _local_238 = auVar34;
  local_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_d0.tutorialData = data;
  while( true ) {
    uStack_200 = 0xffffffff;
    local_204 = 0xffffffff;
    local_228 = 0xffffffff7f800000;
    fVar16 = local_1e8._4_4_;
    fVar11 = fVar16;
    if (fVar16 <= local_1e8._0_4_) {
      fVar11 = local_1e8._0_4_;
    }
    auVar5._4_8_ = auVar34._8_8_;
    auVar5._0_4_ = fVar16;
    auVar19._0_8_ = auVar5._0_8_ << 0x20;
    auVar19._8_4_ = local_1e8._8_4_;
    auVar19._12_4_ = local_1e8._12_4_;
    uVar18 = auVar19._8_8_;
    auVar20._8_8_ = local_1e8._8_8_;
    auVar20._0_8_ = uVar18;
    if (local_1e8._8_4_ <= fVar11) {
      auVar21._4_12_ = auVar20._4_12_;
      auVar21._0_4_ = fVar11;
      uVar18 = auVar21._0_8_;
    }
    if (((float)uVar18 < 0.01) || (0x14 < local_284)) goto LAB_0011e9f6;
    rtcTraversableIntersect1(data->traversable,local_248,&local_50);
    pVVar6 = local_1b0;
    stats->numRays = stats->numRays + 1;
    if ((ulong)uStack_200 == 0xffffffff) break;
    IVar3 = data->ispc_scene->geometries[uStack_200]->type;
    if (IVar3 == TRIANGLE_MESH) {
      auVar26._4_4_ = fStack_214;
      auVar26._0_4_ = local_218;
      auVar26._8_8_ = 0;
      if (0.0 < fStack_210 * fStack_230 +
                fStack_214 * (float)local_238._4_4_ + local_218 * (float)local_238._0_4_) {
        auVar26._0_8_ = CONCAT44(fStack_214,local_218) ^ 0x8000000080000000;
        auVar26._8_4_ = 0x80000000;
        auVar26._12_4_ = 0x80000000;
        fStack_210 = -fStack_210;
        local_218 = -local_218;
        fStack_214 = -fStack_214;
      }
      fVar17 = auVar26._0_4_;
      fVar23 = auVar26._4_4_;
      auVar38._0_4_ = fVar17 * fVar17 + fVar23 * fVar23 + fStack_210 * fStack_210;
      auVar38._4_12_ = auVar26._4_12_;
      auVar35._4_4_ = fVar23;
      auVar35._0_4_ = auVar38._0_4_;
      auVar35._8_4_ = auVar26._8_4_;
      auVar35._12_4_ = auVar26._12_4_;
      auVar34 = rsqrtss(auVar35,auVar38);
      fVar11 = auVar34._0_4_;
      fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * auVar38._0_4_ * 0.5 * fVar11;
      fVar16 = fStack_210 * fVar11;
      local_128._0_4_ = fVar11 * fVar17;
      local_128._4_4_ = fVar11 * fVar23;
      fStack_120 = fVar16;
      register0x0000124c = 0;
      fVar11 = (float)local_238._4_4_ * (float)local_128._0_4_ -
               (float)local_238._0_4_ * (float)local_128._4_4_;
      fVar23 = fStack_230 * (float)local_128._4_4_ - (float)local_238._4_4_ * fVar16;
      fVar28 = (float)local_238._0_4_ * fVar16 - fStack_230 * (float)local_128._0_4_;
      fVar30 = fStack_22c * 0.0 - fStack_22c * 0.0;
      fVar17 = fVar23 * fVar23;
      fVar29 = fVar28 * fVar28;
      fVar31 = fVar30 * fVar30;
      fVar32 = fVar29 + fVar17 + fVar11 * fVar11;
      fVar36 = fVar31 + fVar17 + fVar17;
      fVar29 = fVar29 + fVar17 + fVar29;
      fVar31 = fVar31 + fVar17 + fVar31;
      auVar39._4_4_ = fVar36;
      auVar39._0_4_ = fVar32;
      auVar39._8_4_ = fVar29;
      auVar39._12_4_ = fVar31;
      auVar4._4_4_ = fVar36;
      auVar4._0_4_ = fVar32;
      auVar4._8_4_ = fVar29;
      auVar4._12_4_ = fVar31;
      auVar34 = rsqrtss(auVar39,auVar4);
      fVar17 = auVar34._0_4_;
      fVar17 = fVar17 * 1.5 - fVar17 * fVar17 * fVar32 * 0.5 * fVar17;
      local_168.m128[0] = fVar17 * fVar23;
      local_168.m128[1] = fVar17 * fVar28;
      local_168.m128[2] = fVar17 * fVar11;
      local_168.m128[3] = fVar17 * fVar30;
      local_108 = 0x3f8000003f800000;
      uStack_100 = 0x3f8000003f800000;
      local_f8 = 0;
      uStack_f0 = 0;
      fStack_140 = local_168.m128[1] * (float)local_128._0_4_ -
                   (float)local_128._4_4_ * local_168.m128[0];
      local_148 = local_168.m128[2] * (float)local_128._4_4_ - fVar16 * local_168.m128[1];
      fStack_144 = local_168.m128[0] * fVar16 - (float)local_128._0_4_ * local_168.m128[2];
      fVar17 = local_168.m128[3] * 0.0 - local_168.m128[3] * 0.0;
      fVar11 = local_148 * local_148;
      fVar16 = fStack_144 * fStack_144;
      fVar23 = fVar17 * fVar17;
      fVar28 = fVar16 + fVar11 + fStack_140 * fStack_140;
      auVar40._0_8_ = CONCAT44(fVar23 + fVar11 + fVar11,fVar28);
      auVar40._8_4_ = fVar16 + fVar11 + fVar16;
      auVar40._12_4_ = fVar23 + fVar11 + fVar23;
      auVar27._8_4_ = auVar40._8_4_;
      auVar27._0_8_ = auVar40._0_8_;
      auVar27._12_4_ = auVar40._12_4_;
      auVar34 = rsqrtss(auVar27,auVar40);
      fVar11 = auVar34._0_4_;
      fStack_13c = fVar11 * 1.5 - fVar11 * fVar11 * fVar28 * 0.5 * fVar11;
      local_148 = fStack_13c * local_148;
      fStack_144 = fStack_13c * fStack_144;
      fStack_140 = fStack_13c * fStack_140;
      fStack_13c = fStack_13c * fVar17;
      local_158 = 0x3f800000;
      local_138 = 0x3f800000;
      local_118 = 0x3ef476443ea2f983;
      local_e8 = 0x3f800000;
    }
    else {
      uVar18 = extraout_XMM1_Qa;
      if (IVar3 != CURVES) goto LAB_0011e9f6;
      fVar16 = local_218 * local_218 + fStack_214 * fStack_214 + fStack_210 * fStack_210;
      auVar34 = rsqrtss(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
      fVar11 = auVar34._0_4_;
      fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar16 * 0.5 * fVar11;
      local_b8._0_4_ = local_218 * fVar11;
      fVar16 = fVar11 * fStack_214;
      fVar11 = fVar11 * fStack_210;
      local_b8._4_4_ = fVar16;
      local_b8._8_4_ = fVar11;
      uStack_ac = 0;
      fVar17 = (float)local_238._0_4_ * fVar16 - (float)local_238._4_4_ * (float)local_b8._0_4_;
      fVar28 = (float)local_238._4_4_ * fVar11 - fStack_230 * fVar16;
      fVar29 = fStack_230 * (float)local_b8._0_4_ - (float)local_238._0_4_ * fVar11;
      fVar31 = fStack_22c * 0.0 - fStack_22c * 0.0;
      fVar23 = fVar28 * fVar28;
      fVar30 = fVar29 * fVar29;
      fVar32 = fVar31 * fVar31;
      fVar36 = fVar30 + fVar23 + fVar17 * fVar17;
      auVar37._0_8_ = CONCAT44(fVar32 + fVar23 + fVar23,fVar36);
      auVar37._8_4_ = fVar30 + fVar23 + fVar30;
      auVar37._12_4_ = fVar32 + fVar23 + fVar32;
      auVar24._8_4_ = auVar37._8_4_;
      auVar24._0_8_ = auVar37._0_8_;
      auVar24._12_4_ = auVar37._12_4_;
      auVar34 = rsqrtss(auVar24,auVar37);
      fVar23 = auVar34._0_4_;
      fVar23 = fVar23 * 1.5 - fVar23 * fVar23 * fVar36 * 0.5 * fVar23;
      local_258.m128[0] = fVar23 * fVar28;
      local_258.m128[1] = fVar23 * fVar29;
      local_258.m128[2] = fVar23 * fVar17;
      local_258.m128[3] = fVar23 * fVar31;
      fVar17 = fVar16 * local_258.m128[0] - local_258.m128[1] * (float)local_b8._0_4_;
      fVar16 = fVar11 * local_258.m128[1] - local_258.m128[2] * fVar16;
      fVar23 = (float)local_b8._0_4_ * local_258.m128[2] - local_258.m128[0] * fVar11;
      fVar29 = local_258.m128[3] * 0.0 - local_258.m128[3] * 0.0;
      fVar11 = fVar16 * fVar16;
      fVar28 = fVar23 * fVar23;
      fVar30 = fVar29 * fVar29;
      fVar31 = fVar28 + fVar11 + fVar17 * fVar17;
      auVar25._0_8_ = CONCAT44(fVar30 + fVar11 + fVar11,fVar31);
      auVar25._8_4_ = fVar28 + fVar11 + fVar28;
      auVar25._12_4_ = fVar30 + fVar11 + fVar30;
      auVar14._8_4_ = auVar25._8_4_;
      auVar14._0_8_ = auVar25._0_8_;
      auVar14._12_4_ = auVar25._12_4_;
      auVar34 = rsqrtss(auVar14,auVar25);
      fVar11 = auVar34._0_4_;
      fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar31 * 0.5 * fVar11;
      local_1c8.m128[0] = fVar11 * fVar16;
      local_1c8.m128[1] = fVar11 * fVar23;
      local_1c8.m128[2] = fVar11 * fVar17;
      local_1c8.m128[3] = fVar11 * fVar29;
      AnisotropicBlinn__Constructor
                ((AnisotropicBlinn *)&local_168.field_1,local_1b0,local_1b8,(Vec3fa *)local_b8,20.0,
                 (Vec3fa *)&local_258.field_1,2.0,(Vec3fa *)&local_1c8.field_1);
      local_108 = *(undefined8 *)&pVVar6->field_0;
      uStack_100 = *(undefined8 *)((long)&pVVar6->field_0 + 8);
    }
    local_a8.m128[0] = -(data->dirlight_direction).field_0.m128[0];
    local_a8.m128[1] = -(data->dirlight_direction).field_0.m128[1];
    local_a8.m128[2] = -(data->dirlight_direction).field_0.m128[2];
    local_b8._4_4_ = (float)local_228 * (float)local_238._4_4_ + (float)local_248._4_4_;
    local_b8._0_4_ = (float)local_228 * (float)local_238._0_4_ + (float)local_248._0_4_;
    local_b8._8_4_ = (float)local_228 * fStack_230 + fStack_240;
    uStack_ac = 0x38d1b717;
    local_a8.m128[3] = fStack_17c;
    local_98._0_4_ = INFINITY;
    local_98._4_4_ = 0xffffffff;
    local_74 = 0xffffffff;
    uStack_70 = 0xffffffff;
    auStack_6c[0] = 0xffffffff;
    auStack_68[0] = 0xffffffff;
    occluded((embree *)&local_258.field_1,data->traversable,&local_d0,(Ray *)local_b8);
    stats->numRays = stats->numRays + 1;
    local_1d8.m128[0] = -(float)local_238._0_4_;
    local_1d8.m128[1] = -(float)local_238._4_4_;
    local_1d8.m128[2] = -fStack_230;
    local_1d8.m128[3] = -fStack_22c;
    local_1a8 = -(data->dirlight_direction).field_0.m128[0];
    fStack_1a4 = -(data->dirlight_direction).field_0.m128[1];
    fStack_1a0 = -(data->dirlight_direction).field_0.m128[2];
    fStack_19c = -(data->dirlight_direction).field_0.m128[3];
    AnisotropicBlinn__eval
              ((embree *)&local_1c8.field_1,(AnisotropicBlinn *)&local_168.field_1,
               (Vec3fa *)&local_1d8.field_1,(Vec3fa *)&local_1a8);
    iVar7 = uVar10 * 0x19660d;
    local_278._4_4_ =
         (float)local_278._4_4_ +
         local_1c8.m128[1] * (float)local_1e8._4_4_ * local_258.m128[1] *
         (data->dirlight_intensity).field_0.m128[1];
    local_278._0_4_ =
         (float)local_278._0_4_ +
         local_1c8.m128[0] * (float)local_1e8._0_4_ * local_258.m128[0] *
         (data->dirlight_intensity).field_0.m128[0];
    fStack_270 = fStack_270 +
                 local_1c8.m128[2] * fStack_1e0 * local_258.m128[2] *
                 (data->dirlight_intensity).field_0.m128[2];
    fStack_26c = fStack_26c +
                 local_1c8.m128[3] * fStack_1dc * local_258.m128[3] *
                 (data->dirlight_intensity).field_0.m128[3];
    iVar8 = uVar10 * 0x17385ca9;
    uVar10 = uVar10 * -0x50b6f56b + 0xd1ccf6e9;
    local_178.m128[0] = -(float)local_238._0_4_;
    local_178.m128[1] = -(float)local_238._4_4_;
    local_178.m128[2] = -fStack_230;
    local_178.m128[3] = -fStack_22c;
    VVar41 = AnisotropicBlinn__sample
                       ((embree *)&local_1a8,(AnisotropicBlinn *)&local_168.field_1,
                        (Vec3fa *)&local_178.field_1,(Vec3ff *)&local_1d8.field_1,
                        (float)(iVar7 + 0x3c6ef35fU >> 1) * 4.656613e-10,
                        (float)(iVar8 + 0x47502932U >> 1) * 4.656613e-10,
                        (float)(uVar10 >> 1) * 4.656613e-10);
    uVar18 = VVar41.field_0._8_8_;
    if (local_1d8.m128[3] <= 0.0) goto LAB_0011e9f6;
    auVar34._4_4_ = fStack_1a4;
    auVar34._0_4_ = local_1a8;
    auVar34._8_4_ = fStack_1a0;
    auVar34._12_4_ = fStack_19c;
    fVar11 = *(float *)(&DAT_0021dca4 +
                       (ulong)(local_1d8.m128[2] * fStack_120 +
                               local_1d8.m128[1] * (float)local_128._4_4_ +
                               local_1d8.m128[0] * (float)local_128._0_4_ < 0.0) * 4);
    local_248._4_4_ =
         fVar11 * (float)local_128._4_4_ +
         (float)local_228 * (float)local_238._4_4_ + (float)local_248._4_4_;
    local_248._0_4_ =
         fVar11 * (float)local_128._0_4_ +
         (float)local_228 * (float)local_238._0_4_ + (float)local_248._0_4_;
    fStack_240 = fVar11 * fStack_120 + (float)local_228 * fStack_230 + fStack_240;
    local_238._4_4_ = local_1d8.m128[1];
    local_238._0_4_ = local_1d8.m128[0];
    fStack_230 = local_1d8.m128[2];
    uStack_23c = 0x3a83126f;
    fStack_22c = local_198;
    auVar22._0_4_ = (float)local_1e8._0_4_ * local_1a8;
    auVar22._4_4_ = (float)local_1e8._4_4_ * fStack_1a4;
    auVar22._8_4_ = fStack_1e0 * fStack_1a0;
    auVar22._12_4_ = fStack_1dc * fStack_19c;
    auVar15._4_4_ = local_1d8.m128[3];
    auVar15._0_4_ = local_1d8._12_4_;
    auVar15._8_4_ = local_1d8.m128[3];
    auVar15._12_4_ = local_1d8.m128[3];
    _local_1e8 = divps(auVar22,auVar15);
    local_284 = local_284 + 1;
  }
  fVar11 = (float)local_1e8._0_4_ * (data->ambient_intensity).field_0.m128[0];
  fVar16 = (float)local_1e8._4_4_ * (data->ambient_intensity).field_0.m128[1];
  uVar18 = CONCAT44(fVar16,fVar11);
  local_278._0_4_ = (float)local_278._0_4_ + fVar11;
  local_278._4_4_ = (float)local_278._4_4_ + fVar16;
  fStack_270 = fStack_270 + fStack_1e0 * (data->ambient_intensity).field_0.m128[2];
  fStack_26c = fStack_26c + fStack_1dc * (data->ambient_intensity).field_0.m128[3];
LAB_0011e9f6:
  *(undefined1 (*) [16])this = _local_278;
  VVar41.field_0._0_8_ = local_278;
  VVar41.field_0._8_8_ = uVar18;
  return (Vec3fa)VVar41.field_0;
}

Assistant:

Vec3fa renderPixel(const TutorialData& data, float x, float y, const ISPCCamera& camera, RayStats& stats)
{
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, data.accu_count);
  x += RandomSampler_get1D(sampler);
  y += RandomSampler_get1D(sampler);
  float time = RandomSampler_get1D(sampler);

  RayQueryContext context;
  InitIntersectionContext(&context);
  context.tutorialData = (void*) &data;

  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.context = &context.context;
  args.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  Vec3fa color = Vec3fa(0.0f);
  Vec3fa weight = Vec3fa(1.0f);
  unsigned int depth = 0;

  while (true)
  {
    /* terminate ray path */
    if (reduce_max(weight) < 0.01f || depth > 20)
      return color;

    /* intersect ray with scene and gather all hits */
    rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
    RayStats_addRay(stats);

    /* exit if we hit environment */
    if (ray.geomID == RTC_INVALID_GEOMETRY_ID)
      return color + weight*Vec3fa(data.ambient_intensity);

    /* calculate transmissivity of hair */
    AnisotropicBlinn brdf;
    float eps = 0.0001f;

    ISPCGeometry* geometry = data.ispc_scene->geometries[ray.geomID];
    if (geometry->type == CURVES)
    {
      /* calculate tangent space */
      const Vec3fa dx = normalize(ray.Ng);
      const Vec3fa dy = normalize(cross(ray.dir,dx));
      const Vec3fa dz = normalize(cross(dy,dx));

      /* generate anisotropic BRDF */
      AnisotropicBlinn__Constructor(&brdf,data.hair_Kr,data.hair_Kt,dx,20.0f,dy,2.0f,dz);
      brdf.Kr = data.hair_Kr;
    }
    else if (geometry->type == TRIANGLE_MESH)
    {
      if (dot(ray.dir,ray.Ng) > 0) ray.Ng = neg(ray.Ng);

      /* calculate tangent space */
      const Vec3fa dz = normalize(ray.Ng);
      const Vec3fa dx = normalize(cross(dz,ray.dir));
      const Vec3fa dy = normalize(cross(dz,dx));

      /* generate isotropic BRDF */
      AnisotropicBlinn__Constructor(&brdf,Vec3fa(1.0f),Vec3fa(0.0f),dx,1.0f,dy,1.0f,dz);
    }
    else
      return color;

    /* sample directional light */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(Vec3fa(data.dirlight_direction)), eps, inf, time);
    Vec3fa T = occluded(data.traversable,&context,shadow);
    RayStats_addShadowRay(stats);
    Vec3fa c = AnisotropicBlinn__eval(&brdf,neg(ray.dir),neg(Vec3fa(data.dirlight_direction)));
    color = color + weight*c*T*Vec3fa(data.dirlight_intensity);

#if 1
    /* sample BRDF */
    Vec3ff wi;
    float ru = RandomSampler_get1D(sampler);
    float rv = RandomSampler_get1D(sampler);
    float rw = RandomSampler_get1D(sampler);
    c = AnisotropicBlinn__sample(&brdf,neg(ray.dir),wi,ru,rv,rw);
    if (wi.w <= 0.0f) return color;

    /* calculate secondary ray and offset it out of the hair */
    float sign = dot(Vec3fa(wi),brdf.dz) < 0.0f ? -1.0f : 1.0f;
    ray.org = Vec3ff(ray.org + ray.tfar*ray.dir + sign*eps*brdf.dz);
    ray.dir = Vec3ff(wi);
    ray.tnear() = 0.001f;
    ray.tfar = inf;
    ray.geomID = RTC_INVALID_GEOMETRY_ID;
    ray.primID = RTC_INVALID_GEOMETRY_ID;
    ray.mask = -1;
    ray.time() = time;
    weight = weight * c/wi.w;

#else

    /* continue with transparency ray */
    ray.geomID = RTC_INVALID_GEOMETRY_ID;
    ray.tnear() = 1.001f*ray.tfar;
    ray.tfar = inf;
    weight *= brdf.Kt;

#endif

    depth++;
  }
  return color;
}